

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptFunction.cpp
# Opt level: O1

JavascriptString * __thiscall Js::ScriptFunction::EnsureSourceString(ScriptFunction *this)

{
  uint uVar1;
  uint uVar2;
  ScriptContext *scriptContext;
  Utf8SourceInfo *pUVar3;
  code *pcVar4;
  bool bVar5;
  uint uVar6;
  BOOL BVar7;
  FunctionProxy *this_00;
  ParseableFunctionInfo *this_01;
  JavascriptString *sourceString;
  undefined4 *puVar8;
  uint *puVar9;
  char16 *pcVar10;
  WritableString *pWVar11;
  Recycler *this_02;
  char16 *src;
  uint uVar12;
  ulong uVar13;
  size_t size;
  undefined1 local_78 [8];
  TrackAllocData data;
  LPCUTF8 pbStart;
  BufferStringBuilder builder;
  ulong local_38;
  
  this_00 = GetFunctionProxy(this);
  this_01 = FunctionProxy::EnsureDeserialized(this_00);
  sourceString = ParseableFunctionInfo::GetCachedSourceString(this_01);
  if (sourceString == (JavascriptString *)0x0) {
    scriptContext =
         (((((this->super_ScriptFunctionBase).super_JavascriptFunction.super_DynamicObject.
             super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase)
         .scriptContext.ptr;
    pUVar3 = (this_01->super_FunctionProxy).m_utf8SourceInfo.ptr;
    if (((pUVar3 == (Utf8SourceInfo *)0x0) || ((pUVar3->field_0xa8 & 4) == 0)) &&
       (((this_01->super_FunctionProxy).field_0x46 & 8) == 0)) {
      if (((pUVar3->field_0xa8 & 8) == 0) &&
         (((pUVar3->field_0xa8 & 0x10) == 0 ||
          (scriptContext->threadContext->hasUnhandledException == false)))) {
        uVar1 = this_01->m_cchLength;
        uVar2 = this_01->m_cbLength;
        local_38 = (ulong)uVar2;
        data._32_8_ = ParseableFunctionInfo::GetToStringSource
                                (this_01,L"ScriptFunction::EnsureSourceString");
        puVar9 = (uint *)FunctionProxy::GetAuxPtr(&this_01->super_FunctionProxy,PrintOffsets);
        if (puVar9 == (uint *)0x0) {
          uVar13 = 0;
        }
        else {
          if (puVar9[1] - *puVar9 < uVar2) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar8 = 1;
            bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ScriptFunction.cpp"
                                        ,0x182,
                                        "((printOffsets->cbEndPrintOffset - printOffsets->cbStartPrintOffset) >= cbLength)"
                                        ,
                                        "(printOffsets->cbEndPrintOffset - printOffsets->cbStartPrintOffset) >= cbLength"
                                       );
            if (!bVar5) goto LAB_00d58bf4;
            *puVar8 = 0;
          }
          uVar2 = puVar9[1];
          uVar12 = *puVar9;
          uVar6 = ParseableFunctionInfo::StartOffset(this_01);
          if (uVar6 < *puVar9) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            builder.m_string = (WritableString *)__tls_get_addr(&PTR_0155fe48);
            *(undefined4 *)
             &((builder.m_string)->super_JavascriptString).super_RecyclableObject.
              super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = 1;
            bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ScriptFunction.cpp"
                                        ,0x185,
                                        "(pFuncBody->StartOffset() >= printOffsets->cbStartPrintOffset)"
                                        ,
                                        "pFuncBody->StartOffset() >= printOffsets->cbStartPrintOffset"
                                       );
            if (!bVar5) goto LAB_00d58bf4;
            *(undefined4 *)
             &((builder.m_string)->super_JavascriptString).super_RecyclableObject.
              super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = 0;
          }
          uVar13 = (uVar2 - uVar12) - local_38;
          local_38 = (ulong)(puVar9[1] - *puVar9);
        }
        if (0x7ffffffd < uVar13) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar8 = 1;
          bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ScriptFunction.cpp"
                                      ,0x188,"(cbPreludeLength < MaxCharCount)",
                                      "cbPreludeLength < MaxCharCount");
          if (!bVar5) goto LAB_00d58bf4;
          *puVar8 = 0;
        }
        uVar12 = (int)uVar13 + uVar1;
        pbStart = (LPCUTF8)BufferStringBuilder::WritableString::New(uVar12,scriptContext);
        uVar2 = *(uint *)&((this_01->super_FunctionProxy).m_utf8SourceInfo.ptr)->field_0xa8;
        builder.m_string = (WritableString *)(ulong)uVar1;
        BufferStringBuilder::DbgAssertNotFrozen((BufferStringBuilder *)&pbStart);
        pcVar10 = JavascriptString::UnsafeGetBuffer((JavascriptString *)pbStart);
        pWVar11 = (WritableString *)
                  utf8::DecodeUnitsInto
                            (pcVar10,(LPCUTF8 *)&data.line,(LPCUTF8)(local_38 + data._32_8_),
                             uVar2 >> 1 & doAllowThreeByteSurrogates,(bool *)0x0);
        if (pWVar11 < builder.m_string) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar8 = 1;
          bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ScriptFunction.cpp"
                                      ,0x194,"(false)",
                                      "Decoded incorrect number of characters for function body");
          if (bVar5) {
            *puVar8 = 0;
            Throw::FatalInternalError(-0x7fffbffb);
          }
          goto LAB_00d58bf4;
        }
        if (pWVar11 < (WritableString *)(ulong)uVar12) {
          data.plusSize =
               (long)&(pWVar11->super_JavascriptString).super_RecyclableObject.
                      super_FinalizableObject.super_IRecyclerVisitedObject.
                      _vptr_IRecyclerVisitedObject + 1;
          local_78 = (undefined1  [8])&char16_t::typeinfo;
          data.typeinfo = (type_info *)0x0;
          data.count = (size_t)anon_var_dwarf_8da368f;
          data.filename._0_4_ = 0x19b;
          this_02 = Memory::Recycler::TrackAllocInfo
                              (scriptContext->recycler,(TrackAllocData *)local_78);
          size = 0xffffffffffffffff;
          if (-2 < (long)pWVar11) {
            size = (long)pWVar11 * 2 + 2;
          }
          BVar7 = ExceptionCheck::CanHandleOutOfMemory();
          if (BVar7 == 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar8 = 1;
            bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                        ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                        "ExceptionCheck::CanHandleOutOfMemory()");
            if (!bVar5) goto LAB_00d58bf4;
            *puVar8 = 0;
          }
          if (size == 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar8 = 1;
            bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                        ,0x1fc,"(byteSize != 0 || !TAllocator::FakeZeroLengthArray)"
                                        ,"byteSize != 0 || !TAllocator::FakeZeroLengthArray");
            if (!bVar5) goto LAB_00d58bf4;
            *puVar8 = 0;
          }
          pcVar10 = (char16 *)
                    Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>
                              (this_02,size);
          if (pcVar10 == (char16 *)0x0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar8 = 1;
            bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                        ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
            if (!bVar5) goto LAB_00d58bf4;
            *puVar8 = 0;
          }
          BufferStringBuilder::DbgAssertNotFrozen((BufferStringBuilder *)&pbStart);
          src = JavascriptString::UnsafeGetBuffer((JavascriptString *)pbStart);
          memcpy_s(pcVar10,(long)pWVar11 * 2,src,(long)pWVar11 * 2);
          pcVar10[(long)pWVar11] = L'\0';
          sourceString = JavascriptString::NewWithBuffer(pcVar10,(charcount_t)pWVar11,scriptContext)
          ;
        }
        else {
          sourceString = BufferStringBuilder::ToString((BufferStringBuilder *)&pbStart);
        }
      }
      else {
        sourceString = StringCache::GetXDomainFunctionDisplay
                                 (&((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                                   stringCache);
      }
    }
    else {
      local_78 = (undefined1  [8])((ulong)local_78 & 0xffffffff00000000);
      pcVar10 = FunctionProxy::GetShortDisplayName
                          (&this_01->super_FunctionProxy,(charcount_t *)local_78);
      sourceString = JavascriptFunction::GetLibraryCodeDisplayString(scriptContext,pcVar10);
    }
    if (sourceString == (JavascriptString *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ScriptFunction.cpp"
                                  ,0x1aa,"(cachedSourceString != nullptr)",
                                  "cachedSourceString != nullptr");
      if (!bVar5) {
LAB_00d58bf4:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar8 = 0;
    }
    ParseableFunctionInfo::SetCachedSourceString(this_01,sourceString);
  }
  return sourceString;
}

Assistant:

JavascriptString * ScriptFunction::EnsureSourceString()
    {
        // The function may be defer serialize, need to be deserialized
        FunctionProxy* proxy = this->GetFunctionProxy();
        ParseableFunctionInfo * pFuncBody = proxy->EnsureDeserialized();
        JavascriptString * cachedSourceString = pFuncBody->GetCachedSourceString();
        if (cachedSourceString != nullptr)
        {
            return cachedSourceString;
        }

        ScriptContext * scriptContext = this->GetScriptContext();

        //Library code should behave the same way as RuntimeFunctions
        Utf8SourceInfo* source = pFuncBody->GetUtf8SourceInfo();
        if ((source != nullptr && source->GetIsLibraryCode())
#ifdef ENABLE_WASM
            || (pFuncBody->IsWasmFunction())
#endif
            )
        {
            //Don't display if it is anonymous function
            charcount_t displayNameLength = 0;
            PCWSTR displayName = pFuncBody->GetShortDisplayName(&displayNameLength);
            cachedSourceString = JavascriptFunction::GetLibraryCodeDisplayString(scriptContext, displayName);
        }
        else if (!pFuncBody->GetUtf8SourceInfo()->GetIsXDomain()
            // To avoid backward compat issue, we will not give out sourceString for function if it is called from
            // window.onerror trying to retrieve arguments.callee.caller.
            && !(pFuncBody->GetUtf8SourceInfo()->GetIsXDomainString() && scriptContext->GetThreadContext()->HasUnhandledException())
            )
        {
            // Decode UTF8 into Unicode
            // Consider: Should we have a JavascriptUtf8Substring class which defers decoding
            // until it's needed?

            charcount_t cch = pFuncBody->LengthInChars();
            size_t cbLength = pFuncBody->LengthInBytes();
            LPCUTF8 pbStart = pFuncBody->GetToStringSource(_u("ScriptFunction::EnsureSourceString"));
            size_t cbPreludeLength = 0;
            // cch and cbLength refer to the length of the parse, which may be smaller than the length of the to-string function
            PrintOffsets* printOffsets = pFuncBody->GetPrintOffsets();
            if (printOffsets != nullptr)
            {
                Assert((printOffsets->cbEndPrintOffset - printOffsets->cbStartPrintOffset) >= cbLength);
                cbPreludeLength = (printOffsets->cbEndPrintOffset - printOffsets->cbStartPrintOffset) - cbLength;

                Assert(pFuncBody->StartOffset() >= printOffsets->cbStartPrintOffset);
                cbLength = printOffsets->cbEndPrintOffset - printOffsets->cbStartPrintOffset;
            }
            Assert(cbPreludeLength < MaxCharCount);
            // the toString of a function may include some prelude, e.g. the computed name expression.
            // We do not store the char-index of the start, but if there are cbPreludeLength bytes difference,
            // then that is an upper bound on the number of characters difference.
            // We also assume that function.toString is relatively infrequent, and non-ascii characters in
            // a prelude are relatively infrequent, so the inaccuracy here should in general be insignificant
            BufferStringBuilder builder(cch + static_cast<charcount_t>(cbPreludeLength), scriptContext);
            utf8::DecodeOptions options = pFuncBody->GetUtf8SourceInfo()->IsCesu8() ? utf8::doAllowThreeByteSurrogates : utf8::doDefault;
            size_t decodedCount = utf8::DecodeUnitsInto(builder.DangerousGetWritableBuffer(), pbStart, pbStart + cbLength, options);

            if (decodedCount < cch)
            {
                AssertMsg(false, "Decoded incorrect number of characters for function body");
                Js::Throw::FatalInternalError();
            }
            else if (decodedCount < cch + static_cast<charcount_t>(cbPreludeLength))
            {
                Recycler* recycler = scriptContext->GetRecycler();

                char16* buffer = RecyclerNewArrayLeaf(recycler, char16, decodedCount + 1);
                wmemcpy_s(buffer, decodedCount, builder.DangerousGetWritableBuffer(), decodedCount);
                buffer[decodedCount] = 0;

                cachedSourceString = JavascriptString::NewWithBuffer(buffer, static_cast<charcount_t>(decodedCount), scriptContext);
            }
            else
            {
                cachedSourceString = builder.ToString();
            }
        }
        else
        {
            cachedSourceString = scriptContext->GetLibrary()->GetXDomainFunctionDisplayString();
        }
        Assert(cachedSourceString != nullptr);
        pFuncBody->SetCachedSourceString(cachedSourceString);
        return cachedSourceString;
    }